

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
::increment(btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_&,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_*>
            *this)

{
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *pbVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *pbVar5;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *pbVar6;
  int iVar7;
  char *__function;
  size_type i;
  int iStack_10;
  
  pbVar6 = this->node;
  if (((ulong)pbVar6 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if ((pbVar6[0xb] !=
       (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
        )0x0) &&
     (iVar7 = this->position + 1, this->position = iVar7, iVar7 < (int)(uint)(byte)pbVar6[10])) {
    return;
  }
  pbVar6 = this->node;
  if (((ulong)pbVar6 & 7) == 0) {
    uVar4 = this->position;
    if (pbVar6[0xb] ==
        (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
         )0x0) {
      if ((int)(uint)(byte)pbVar6[10] <= (int)uVar4) {
        __assert_fail("position < node->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x97d,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>, std::pair<const std::pair<int, int>, std::pair<int, int>> &, std::pair<const std::pair<int, int>, std::pair<int, int>> *>::increment_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>, Reference = std::pair<const std::pair<int, int>, std::pair<int, int>> &, Pointer = std::pair<const std::pair<int, int>, std::pair<int, int>> *]"
                     );
      }
      i = (long)(int)uVar4 + 1;
      while( true ) {
        pbVar6 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                 ::child(pbVar6,i);
        this->node = pbVar6;
        if (((ulong)pbVar6 & 7) != 0) break;
        if (pbVar6[0xb] !=
            (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
             )0x0) {
          this->position = 0;
          return;
        }
        i = 0;
      }
    }
    else {
      if ((int)uVar4 < (int)(uint)(byte)pbVar6[10]) {
        __assert_fail("position >= node->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x972,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>, std::pair<const std::pair<int, int>, std::pair<int, int>> &, std::pair<const std::pair<int, int>, std::pair<int, int>> *>::increment_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>, Reference = std::pair<const std::pair<int, int>, std::pair<int, int>> &, Pointer = std::pair<const std::pair<int, int>, std::pair<int, int>> *]"
                     );
      }
      pbVar1 = this->node;
      uVar2 = *(undefined8 *)&this->position;
      do {
        if (uVar4 != (byte)pbVar6[10]) {
LAB_0021f7cd:
          if (((ulong)pbVar6 & 7) == 0) {
            if (this->position == (uint)(byte)pbVar6[10]) {
              iStack_10 = (int)uVar2;
              this->position = iStack_10;
              this->node = pbVar1;
            }
            return;
          }
          break;
        }
        bVar3 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                ::is_root(pbVar6);
        pbVar6 = this->node;
        if (bVar3) goto LAB_0021f7cd;
        if (((ulong)pbVar6 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_0021f854;
        }
        pbVar5 = btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                 ::child(*(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                           **)pbVar6,(ulong)(byte)pbVar6[8]);
        pbVar6 = this->node;
        if (pbVar5 != pbVar6) {
          __assert_fail("node->parent()->child(node->position()) == node",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x975,
                        "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>, std::pair<const std::pair<int, int>, std::pair<int, int>> &, std::pair<const std::pair<int, int>, std::pair<int, int>> *>::increment_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>, Reference = std::pair<const std::pair<int, int>, std::pair<int, int>> &, Pointer = std::pair<const std::pair<int, int>, std::pair<int, int>> *]"
                       );
        }
        if (((ulong)pbVar5 & 7) != 0) break;
        uVar4 = (uint)(byte)pbVar6[8];
        this->position = uVar4;
        pbVar6 = *(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                   **)pbVar6;
        this->node = pbVar6;
      } while (((ulong)pbVar6 & 7) == 0);
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_0021f854:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void increment() {
            if (node->leaf() && ++position < node->count()) {
                return;
            }
            increment_slow();
        }